

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QList<QLocale> *
QLocale::matchingLocales
          (QList<QLocale> *__return_storage_ptr__,Language language,Script script,
          Territory territory)

{
  qsizetype *pqVar1;
  Language LVar2;
  uint uVar3;
  bool bVar4;
  QLocale *this;
  undefined **dd;
  uint uVar5;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  undefined6 in_register_00000032;
  QLocale *this_00;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QArrayData *d;
  QLocale local_48;
  QLocale local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)CONCAT62(in_register_0000000a,territory);
  if ((0x8e < (uint)CONCAT62(in_register_00000012,script) ||
      0x15a < (uint)CONCAT62(in_register_00000032,language)) || 0x105 < uVar5) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QLocale *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_0030e062;
  }
  if (language == C) {
    this_00 = &local_40;
    QLocale(this_00,C,AnyScript,AnyCountry);
    local_48.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
    this = (QLocale *)QArrayData::allocate((QArrayData **)&local_48,8,0x10,1,KeepSize);
    (__return_storage_ptr__->d).d = (Data *)local_48.d.d.ptr;
    (__return_storage_ptr__->d).ptr = this;
    (__return_storage_ptr__->d).size = 0;
    QLocale(this,this_00);
    pqVar1 = &(__return_storage_ptr__->d).size;
    *pqVar1 = *pqVar1 + 1;
LAB_0030ddb0:
    ~QLocale(this_00);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QLocale *)0x0;
    (__return_storage_ptr__->d).size = 0;
    if ((script == AnyScript && language == AnyLanguage) && territory == AnyCountry) {
      QList<QLocale>::reserve(__return_storage_ptr__,0x2aa);
    }
    uVar7 = (ulong)locale_index[language];
    LVar2 = locale_data[uVar7].m_language_id;
    bVar4 = LVar2 == language;
    if (language == AnyLanguage) {
      bVar4 = LVar2 != AnyLanguage;
    }
    if (bVar4) {
      uVar6 = (uint)locale_index[language];
      do {
        uVar3._0_2_ = locale_data[uVar7].m_script_id;
        uVar3._2_2_ = locale_data[uVar7].m_territory_id;
        if ((uVar3 >> 0x10 == (uVar5 & 0xffff) || territory == AnyCountry) &&
           (script == AnyScript || (undefined2)uVar3 == script)) {
          dd = &c_private()::c_locale;
          if (LVar2 != C) {
            dd = (undefined **)operator_new(0x20);
            ((QLocalePrivate *)dd)->m_data = locale_data + uVar7;
            (((QLocalePrivate *)dd)->ref)._q_value.super___atomic_base<int>._M_i = 0;
            ((QLocalePrivate *)dd)->m_index = uVar7;
            (((QLocalePrivate *)dd)->m_numberOptions).
            super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
            super_QFlagsStorage<QLocale::NumberOption>.i = 0;
          }
          QLocale(&local_48,(QLocalePrivate *)dd);
          QtPrivate::QMovableArrayOps<QLocale>::emplace<QLocale>
                    ((QMovableArrayOps<QLocale> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_48);
          QList<QLocale>::end(__return_storage_ptr__);
          ~QLocale(&local_48);
        }
        uVar6 = uVar6 + 1 & 0xffff;
        uVar7 = (ulong)uVar6;
        LVar2 = locale_data[uVar7].m_language_id;
        bVar4 = LVar2 == language;
        if (language == AnyLanguage) {
          bVar4 = LVar2 != AnyLanguage;
        }
      } while (bVar4);
    }
    systemData((qsizetype *)0x0);
    bVar4 = systemLocaleData.m_language_id != 0;
    if (language != AnyLanguage) {
      bVar4 = systemLocaleData.m_language_id == language;
    }
    if (bVar4) {
      if (((uint)systemLocaleData._2_4_ >> 0x10 == (uVar5 & 0xffff) || territory == AnyCountry) &&
         (script == AnyScript || systemLocaleData.m_script_id == script)) {
        systemData(&system::locale.m_index);
        system::locale.m_numberOptions.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
        super_QFlagsStorage<QLocale::NumberOption>.i._1_3_ = 0;
        system::locale.m_numberOptions.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
        super_QFlagsStorage<QLocale::NumberOption>.i._0_1_ =
             (system::locale.m_data)->m_language_id == 1;
        QLocale(&local_48,&system::locale);
        QtPrivate::QMovableArrayOps<QLocale>::emplace<QLocale>
                  ((QMovableArrayOps<QLocale> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_48);
        QList<QLocale>::end(__return_storage_ptr__);
        this_00 = &local_48;
        goto LAB_0030ddb0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0030e062:
  __stack_chk_fail();
}

Assistant:

QList<QLocale> QLocale::matchingLocales(Language language, Script script, Territory territory)
{
    const QLocaleId filter { language, script, territory };
    if (!filter.isValid())
        return QList<QLocale>();

    if (language == C)
        return QList<QLocale>{QLocale(C)};

    QList<QLocale> result;
    if (filter.matchesAll())
        result.reserve(locale_data_size);

    quint16 index = locale_index[language];
    // There may be no matches, for some languages (e.g. Abkhazian at CLDR v39).
    while (filter.acceptLanguage(locale_data[index].m_language_id)) {
        const QLocaleId id = locale_data[index].id();
        if (filter.acceptScriptTerritory(id)) {
            result.append(QLocale(*(id.language_id == C ? c_private()
                                    : new QLocalePrivate(locale_data + index, index))));
        }
        ++index;
    }

    // Add current system locale, if it matches
    const auto syslocaledata = systemData();

    if (filter.acceptLanguage(syslocaledata->m_language_id)) {
        const QLocaleId id = syslocaledata->id();
        if (filter.acceptScriptTerritory(id))
            result.append(system());
    }

    return result;
}